

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddNestedExtensions(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *filename,
                   DescriptorProto *message_type,pair<const_void_*,_int> value)

{
  undefined1 auVar1 [12];
  bool bVar2;
  Type *message_type_00;
  Type *field;
  int iVar3;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  
  auVar1 = value._0_12_;
  if (0 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar3 = 0;
    do {
      message_type_00 =
           internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                     (&(message_type->nested_type_).super_RepeatedPtrFieldBase,iVar3);
      value_00._12_4_ = 0;
      value_00.first = (void *)auVar1._0_8_;
      value_00.second = auVar1._8_4_;
      bVar2 = AddNestedExtensions(this,filename,message_type_00,value_00);
      if (!bVar2) {
        return false;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((message_type->extension_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    bVar2 = true;
  }
  else {
    iVar3 = 0;
    do {
      field = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                        (&(message_type->extension_).super_RepeatedPtrFieldBase,iVar3);
      value_01._12_4_ = 0;
      value_01.first = (void *)auVar1._0_8_;
      value_01.second = auVar1._8_4_;
      bVar2 = AddExtension(this,filename,field,value_01);
      if (!bVar2) {
        return bVar2;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (message_type->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}